

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ostringstream e;
  char *local_1c0 [4];
  string local_1a0 [11];
  
  std::__cxx11::string::string((string *)local_1a0,"EXPORT_NAME",(allocator *)local_1c0);
  pcVar2 = GetProperty(this,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Target->Name);
  }
  else {
    std::__cxx11::string::string((string *)local_1a0,pcVar2,(allocator *)local_1c0);
    bVar1 = cmGeneratorExpression::IsValidTargetName(local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)local_1a0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar3 = std::operator<<((ostream *)local_1a0,"EXPORT_NAME property \"");
      poVar3 = std::operator<<(poVar3,pcVar2);
      poVar3 = std::operator<<(poVar3,"\" for \"");
      poVar3 = std::operator<<(poVar3,(string *)&this->Target->Name);
      std::operator<<(poVar3,"\": is not valid.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_1c0[0],(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  const char* exportName = this->GetProperty("EXPORT_NAME");

  if (exportName && *exportName) {
    if (!cmGeneratorExpression::IsValidTargetName(exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str().c_str());
      return "";
    }
    return exportName;
  }
  return this->GetName();
}